

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  BaseNode_conflict *node;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  ulong *puVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  float fVar53;
  float fVar58;
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar60;
  undefined1 auVar57 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  float fVar90;
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  uint uVar109;
  uint uVar110;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar111;
  undefined1 auVar108 [32];
  undefined1 auVar112 [16];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  int local_149c;
  undefined1 local_1498 [16];
  RayQueryContext *local_1480;
  undefined1 local_1478 [16];
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  long local_1430;
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong *local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  int *local_13d8;
  undefined8 local_13d0;
  RTCRayQueryContext *local_13c8;
  Ray *local_13c0;
  undefined4 *local_13b8;
  undefined4 local_13b0;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar53 = ray->tfar;
    if (0.0 <= fVar53) {
      local_1480 = context;
      local_1410 = local_11d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar86._8_4_ = 0x7fffffff;
      auVar86._0_8_ = 0x7fffffff7fffffff;
      auVar86._12_4_ = 0x7fffffff;
      auVar86 = vandps_avx((undefined1  [16])aVar5,auVar86);
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      auVar86 = vcmpps_avx(auVar86,auVar91,1);
      auVar86 = vblendvps_avx((undefined1  [16])aVar5,auVar91,auVar86);
      auVar91 = vrcpps_avx(auVar86);
      fVar58 = auVar91._0_4_;
      auVar82._0_4_ = fVar58 * auVar86._0_4_;
      fVar59 = auVar91._4_4_;
      auVar82._4_4_ = fVar59 * auVar86._4_4_;
      fVar60 = auVar91._8_4_;
      auVar82._8_4_ = fVar60 * auVar86._8_4_;
      fVar90 = auVar91._12_4_;
      auVar82._12_4_ = fVar90 * auVar86._12_4_;
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar86 = vsubps_avx(auVar92,auVar82);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_1258._4_4_ = uVar4;
      local_1258._0_4_ = uVar4;
      local_1258._8_4_ = uVar4;
      local_1258._12_4_ = uVar4;
      local_1258._16_4_ = uVar4;
      local_1258._20_4_ = uVar4;
      local_1258._24_4_ = uVar4;
      local_1258._28_4_ = uVar4;
      auVar114 = ZEXT3264(local_1258);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1278._4_4_ = uVar4;
      local_1278._0_4_ = uVar4;
      local_1278._8_4_ = uVar4;
      local_1278._12_4_ = uVar4;
      local_1278._16_4_ = uVar4;
      local_1278._20_4_ = uVar4;
      local_1278._24_4_ = uVar4;
      local_1278._28_4_ = uVar4;
      auVar122 = ZEXT3264(local_1278);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1298._4_4_ = uVar4;
      local_1298._0_4_ = uVar4;
      local_1298._8_4_ = uVar4;
      local_1298._12_4_ = uVar4;
      local_1298._16_4_ = uVar4;
      local_1298._20_4_ = uVar4;
      local_1298._24_4_ = uVar4;
      local_1298._28_4_ = uVar4;
      auVar123 = ZEXT3264(local_1298);
      auVar83._0_4_ = fVar58 + fVar58 * auVar86._0_4_;
      auVar83._4_4_ = fVar59 + fVar59 * auVar86._4_4_;
      auVar83._8_4_ = fVar60 + fVar60 * auVar86._8_4_;
      auVar83._12_4_ = fVar90 + fVar90 * auVar86._12_4_;
      auVar86 = vshufps_avx(auVar83,auVar83,0);
      local_12b8._16_16_ = auVar86;
      local_12b8._0_16_ = auVar86;
      auVar125 = ZEXT3264(local_12b8);
      auVar86 = vmovshdup_avx(auVar83);
      auVar91 = vshufps_avx(auVar83,auVar83,0x55);
      local_12d8._16_16_ = auVar91;
      local_12d8._0_16_ = auVar91;
      auVar127 = ZEXT3264(local_12d8);
      auVar91 = vshufpd_avx(auVar83,auVar83,1);
      auVar82 = vshufps_avx(auVar83,auVar83,0xaa);
      local_1418 = (ulong)(auVar83._0_4_ < 0.0) << 3;
      register0x000012d0 = auVar82;
      _local_11f8 = auVar82;
      uVar42 = (ulong)(auVar86._0_4_ < 0.0);
      lVar1 = uVar42 * 8;
      uVar43 = (ulong)(auVar91._0_4_ < 0.0);
      lVar2 = uVar43 * 8;
      auVar86 = vshufps_avx(auVar54,auVar54,0);
      local_1218._16_16_ = auVar86;
      local_1218._0_16_ = auVar86;
      auVar86 = vshufps_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),0);
      local_1238._16_16_ = auVar86;
      local_1238._0_16_ = auVar86;
      uVar50 = local_1418 ^ 8;
      uVar49 = lVar1 + 0x10U ^ 8;
      uVar52 = lVar2 + 0x20U ^ 8;
      local_13a8 = mm_lookupmask_ps._240_16_;
LAB_00e7552b:
      if (local_1410 != local_11d8) {
        uVar51 = local_1410[-1];
        local_1410 = local_1410 + -1;
        while ((uVar51 & 8) == 0) {
          uVar44 = uVar51 & 0xfffffffffffffff0;
          puVar46 = (ulong *)(uVar44 + 0x40);
          if (uVar44 == 0) {
            puVar46 = (ulong *)0x0;
          }
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *puVar46;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = puVar46[1];
          auVar86 = vpminub_avx(auVar54,auVar72);
          auVar86 = vpcmpeqb_avx(auVar54,auVar86);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)((long)puVar46 + 4);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)((long)puVar46 + 0xc);
          auVar54 = vpminub_avx(auVar61,auVar84);
          fVar53 = *(float *)(puVar46 + 6);
          auVar54 = vpcmpeqb_avx(auVar61,auVar54);
          fVar58 = *(float *)((long)puVar46 + 0x3c);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)((long)puVar46 + local_1418);
          auVar91 = vpmovzxbd_avx(auVar73);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)((long)puVar46 + local_1418 + 4);
          auVar82 = vpmovzxbd_avx(auVar93);
          auVar80._16_16_ = auVar82;
          auVar80._0_16_ = auVar91;
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar81._0_4_ = fVar53 + fVar58 * auVar80._0_4_;
          auVar81._4_4_ = fVar53 + fVar58 * auVar80._4_4_;
          auVar81._8_4_ = fVar53 + fVar58 * auVar80._8_4_;
          auVar81._12_4_ = fVar53 + fVar58 * auVar80._12_4_;
          auVar81._16_4_ = fVar53 + fVar58 * auVar80._16_4_;
          auVar81._20_4_ = fVar53 + fVar58 * auVar80._20_4_;
          auVar81._24_4_ = fVar53 + fVar58 * auVar80._24_4_;
          auVar81._28_4_ = fVar53 + auVar80._28_4_;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)((long)puVar46 + uVar50);
          auVar91 = vpmovzxbd_avx(auVar94);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)((long)puVar46 + uVar50 + 4);
          auVar82 = vpmovzxbd_avx(auVar97);
          auVar95._16_16_ = auVar82;
          auVar95._0_16_ = auVar91;
          auVar80 = vcvtdq2ps_avx(auVar95);
          fVar59 = *(float *)((long)puVar46 + 0x34);
          auVar85._0_4_ = fVar53 + fVar58 * auVar80._0_4_;
          auVar85._4_4_ = fVar53 + fVar58 * auVar80._4_4_;
          auVar85._8_4_ = fVar53 + fVar58 * auVar80._8_4_;
          auVar85._12_4_ = fVar53 + fVar58 * auVar80._12_4_;
          auVar85._16_4_ = fVar53 + fVar58 * auVar80._16_4_;
          auVar85._20_4_ = fVar53 + fVar58 * auVar80._20_4_;
          auVar85._24_4_ = fVar53 + fVar58 * auVar80._24_4_;
          auVar85._28_4_ = fVar53 + fVar58;
          fVar53 = *(float *)(puVar46 + 8);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = puVar46[uVar42 + 2];
          auVar91 = vpmovzxbd_avx(auVar87);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)((long)puVar46 + lVar1 + 0x14);
          auVar82 = vpmovzxbd_avx(auVar99);
          auVar88._16_16_ = auVar82;
          auVar88._0_16_ = auVar91;
          auVar80 = vcvtdq2ps_avx(auVar88);
          auVar89._0_4_ = fVar59 + fVar53 * auVar80._0_4_;
          auVar89._4_4_ = fVar59 + fVar53 * auVar80._4_4_;
          auVar89._8_4_ = fVar59 + fVar53 * auVar80._8_4_;
          auVar89._12_4_ = fVar59 + fVar53 * auVar80._12_4_;
          auVar89._16_4_ = fVar59 + fVar53 * auVar80._16_4_;
          auVar89._20_4_ = fVar59 + fVar53 * auVar80._20_4_;
          auVar89._24_4_ = fVar59 + fVar53 * auVar80._24_4_;
          auVar89._28_4_ = fVar59 + auVar80._28_4_;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = *(ulong *)((long)puVar46 + uVar49);
          auVar91 = vpmovzxbd_avx(auVar100);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = *(ulong *)((long)puVar46 + uVar49 + 4);
          auVar82 = vpmovzxbd_avx(auVar102);
          auVar101._16_16_ = auVar82;
          auVar101._0_16_ = auVar91;
          auVar80 = vcvtdq2ps_avx(auVar101);
          fVar58 = *(float *)(puVar46 + 7);
          auVar96._0_4_ = fVar59 + fVar53 * auVar80._0_4_;
          auVar96._4_4_ = fVar59 + fVar53 * auVar80._4_4_;
          auVar96._8_4_ = fVar59 + fVar53 * auVar80._8_4_;
          auVar96._12_4_ = fVar59 + fVar53 * auVar80._12_4_;
          auVar96._16_4_ = fVar59 + fVar53 * auVar80._16_4_;
          auVar96._20_4_ = fVar59 + fVar53 * auVar80._20_4_;
          auVar96._24_4_ = fVar59 + fVar53 * auVar80._24_4_;
          auVar96._28_4_ = fVar59 + fVar53;
          fVar53 = *(float *)((long)puVar46 + 0x44);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = puVar46[uVar43 + 4];
          auVar91 = vpmovzxbd_avx(auVar103);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)((long)puVar46 + lVar2 + 0x24);
          auVar82 = vpmovzxbd_avx(auVar106);
          auVar104._16_16_ = auVar82;
          auVar104._0_16_ = auVar91;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)((long)puVar46 + uVar52);
          auVar91 = vpmovzxbd_avx(auVar107);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = *(ulong *)((long)puVar46 + uVar52 + 4);
          auVar82 = vpmovzxbd_avx(auVar112);
          auVar108._16_16_ = auVar82;
          auVar108._0_16_ = auVar91;
          auVar80 = vcvtdq2ps_avx(auVar104);
          auVar6 = vcvtdq2ps_avx(auVar108);
          auVar105._0_4_ = auVar80._0_4_ * fVar53 + fVar58;
          auVar105._4_4_ = auVar80._4_4_ * fVar53 + fVar58;
          auVar105._8_4_ = auVar80._8_4_ * fVar53 + fVar58;
          auVar105._12_4_ = auVar80._12_4_ * fVar53 + fVar58;
          auVar105._16_4_ = auVar80._16_4_ * fVar53 + fVar58;
          auVar105._20_4_ = auVar80._20_4_ * fVar53 + fVar58;
          auVar105._24_4_ = auVar80._24_4_ * fVar53 + fVar58;
          auVar105._28_4_ = auVar80._28_4_ + fVar58;
          auVar98._0_4_ = fVar58 + auVar6._0_4_ * fVar53;
          auVar98._4_4_ = fVar58 + auVar6._4_4_ * fVar53;
          auVar98._8_4_ = fVar58 + auVar6._8_4_ * fVar53;
          auVar98._12_4_ = fVar58 + auVar6._12_4_ * fVar53;
          auVar98._16_4_ = fVar58 + auVar6._16_4_ * fVar53;
          auVar98._20_4_ = fVar58 + auVar6._20_4_ * fVar53;
          auVar98._24_4_ = fVar58 + auVar6._24_4_ * fVar53;
          auVar98._28_4_ = fVar58 + fVar53;
          auVar80 = vsubps_avx(auVar81,auVar114._0_32_);
          auVar6._4_4_ = auVar125._4_4_ * auVar80._4_4_;
          auVar6._0_4_ = auVar125._0_4_ * auVar80._0_4_;
          auVar6._8_4_ = auVar125._8_4_ * auVar80._8_4_;
          auVar6._12_4_ = auVar125._12_4_ * auVar80._12_4_;
          auVar6._16_4_ = auVar125._16_4_ * auVar80._16_4_;
          auVar6._20_4_ = auVar125._20_4_ * auVar80._20_4_;
          auVar6._24_4_ = auVar125._24_4_ * auVar80._24_4_;
          auVar6._28_4_ = auVar80._28_4_;
          auVar80 = vsubps_avx(auVar89,auVar122._0_32_);
          auVar17._4_4_ = auVar127._4_4_ * auVar80._4_4_;
          auVar17._0_4_ = auVar127._0_4_ * auVar80._0_4_;
          auVar17._8_4_ = auVar127._8_4_ * auVar80._8_4_;
          auVar17._12_4_ = auVar127._12_4_ * auVar80._12_4_;
          auVar17._16_4_ = auVar127._16_4_ * auVar80._16_4_;
          auVar17._20_4_ = auVar127._20_4_ * auVar80._20_4_;
          auVar17._24_4_ = auVar127._24_4_ * auVar80._24_4_;
          auVar17._28_4_ = auVar80._28_4_;
          auVar80 = vmaxps_avx(auVar6,auVar17);
          auVar6 = vsubps_avx(auVar105,auVar123._0_32_);
          auVar18._4_4_ = (float)local_11f8._4_4_ * auVar6._4_4_;
          auVar18._0_4_ = (float)local_11f8._0_4_ * auVar6._0_4_;
          auVar18._8_4_ = fStack_11f0 * auVar6._8_4_;
          auVar18._12_4_ = fStack_11ec * auVar6._12_4_;
          auVar18._16_4_ = fStack_11e8 * auVar6._16_4_;
          auVar18._20_4_ = fStack_11e4 * auVar6._20_4_;
          auVar18._24_4_ = fStack_11e0 * auVar6._24_4_;
          auVar18._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar18,local_1218);
          auVar80 = vmaxps_avx(auVar80,auVar6);
          auVar6 = vsubps_avx(auVar85,auVar114._0_32_);
          auVar19._4_4_ = auVar125._4_4_ * auVar6._4_4_;
          auVar19._0_4_ = auVar125._0_4_ * auVar6._0_4_;
          auVar19._8_4_ = auVar125._8_4_ * auVar6._8_4_;
          auVar19._12_4_ = auVar125._12_4_ * auVar6._12_4_;
          auVar19._16_4_ = auVar125._16_4_ * auVar6._16_4_;
          auVar19._20_4_ = auVar125._20_4_ * auVar6._20_4_;
          auVar19._24_4_ = auVar125._24_4_ * auVar6._24_4_;
          auVar19._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(auVar96,auVar122._0_32_);
          auVar20._4_4_ = auVar127._4_4_ * auVar6._4_4_;
          auVar20._0_4_ = auVar127._0_4_ * auVar6._0_4_;
          auVar20._8_4_ = auVar127._8_4_ * auVar6._8_4_;
          auVar20._12_4_ = auVar127._12_4_ * auVar6._12_4_;
          auVar20._16_4_ = auVar127._16_4_ * auVar6._16_4_;
          auVar20._20_4_ = auVar127._20_4_ * auVar6._20_4_;
          auVar20._24_4_ = auVar127._24_4_ * auVar6._24_4_;
          auVar20._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar19,auVar20);
          auVar17 = vsubps_avx(auVar98,auVar123._0_32_);
          auVar21._4_4_ = (float)local_11f8._4_4_ * auVar17._4_4_;
          auVar21._0_4_ = (float)local_11f8._0_4_ * auVar17._0_4_;
          auVar21._8_4_ = fStack_11f0 * auVar17._8_4_;
          auVar21._12_4_ = fStack_11ec * auVar17._12_4_;
          auVar21._16_4_ = fStack_11e8 * auVar17._16_4_;
          auVar21._20_4_ = fStack_11e4 * auVar17._20_4_;
          auVar21._24_4_ = fStack_11e0 * auVar17._24_4_;
          auVar21._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar21,local_1238);
          auVar6 = vminps_avx(auVar6,auVar17);
          auVar80 = vcmpps_avx(auVar80,auVar6,2);
          auVar91 = vpcmpeqd_avx(auVar6._0_16_,auVar6._0_16_);
          auVar86 = vpmovsxbd_avx(auVar86 ^ auVar91);
          auVar54 = vpmovsxbd_avx(auVar54 ^ auVar91);
          auVar57._16_16_ = auVar54;
          auVar57._0_16_ = auVar86;
          auVar6 = vcvtdq2ps_avx(auVar57);
          auVar71._8_4_ = 0xbf800000;
          auVar71._0_8_ = 0xbf800000bf800000;
          auVar71._12_4_ = 0xbf800000;
          auVar71._16_4_ = 0xbf800000;
          auVar71._20_4_ = 0xbf800000;
          auVar71._24_4_ = 0xbf800000;
          auVar71._28_4_ = 0xbf800000;
          auVar6 = vcmpps_avx(auVar71,auVar6,1);
          auVar80 = vandps_avx(auVar80,auVar6);
          uVar45 = vmovmskps_avx(auVar80);
          if (uVar45 == 0) goto LAB_00e7552b;
          uVar45 = uVar45 & 0xff;
          lVar48 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
            }
          }
          uVar51 = *(ulong *)(uVar44 + lVar48 * 8);
          uVar45 = uVar45 - 1 & uVar45;
          uVar47 = (ulong)uVar45;
          if (uVar45 != 0) {
            do {
              *local_1410 = uVar51;
              local_1410 = local_1410 + 1;
              lVar48 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
              uVar51 = *(ulong *)(uVar44 + lVar48 * 8);
              uVar47 = uVar47 - 1 & uVar47;
            } while (uVar47 != 0);
          }
        }
        local_1420 = (ulong)((uint)uVar51 & 0xf) - 8;
        uVar51 = uVar51 & 0xfffffffffffffff0;
        for (local_1428 = 0; local_1428 != local_1420; local_1428 = local_1428 + 1) {
          lVar48 = local_1428 * 0xb0;
          pfVar3 = (float *)(uVar51 + 0x80 + lVar48);
          fVar22 = *pfVar3;
          fVar23 = pfVar3[1];
          fVar24 = pfVar3[2];
          fVar25 = pfVar3[3];
          pfVar3 = (float *)(uVar51 + 0x40 + lVar48);
          fVar26 = *pfVar3;
          fVar27 = pfVar3[1];
          fVar28 = pfVar3[2];
          fVar29 = pfVar3[3];
          auVar55._0_4_ = fVar22 * fVar26;
          auVar55._4_4_ = fVar23 * fVar27;
          auVar55._8_4_ = fVar24 * fVar28;
          auVar55._12_4_ = fVar25 * fVar29;
          pfVar3 = (float *)(uVar51 + 0x70 + lVar48);
          fVar30 = *pfVar3;
          fVar31 = pfVar3[1];
          fVar32 = pfVar3[2];
          fVar33 = pfVar3[3];
          pfVar3 = (float *)(uVar51 + 0x50 + lVar48);
          fVar34 = *pfVar3;
          fVar35 = pfVar3[1];
          fVar36 = pfVar3[2];
          fVar37 = pfVar3[3];
          auVar62._0_4_ = fVar30 * fVar34;
          auVar62._4_4_ = fVar31 * fVar35;
          auVar62._8_4_ = fVar32 * fVar36;
          auVar62._12_4_ = fVar33 * fVar37;
          local_1448 = vsubps_avx(auVar62,auVar55);
          auVar86 = *(undefined1 (*) [16])(uVar51 + 0x60 + lVar48);
          fVar113 = auVar86._0_4_;
          auVar63._0_4_ = fVar113 * fVar34;
          fVar115 = auVar86._4_4_;
          auVar63._4_4_ = fVar115 * fVar35;
          fVar116 = auVar86._8_4_;
          auVar63._8_4_ = fVar116 * fVar36;
          fVar117 = auVar86._12_4_;
          auVar63._12_4_ = fVar117 * fVar37;
          pfVar3 = (float *)(uVar51 + 0x30 + lVar48);
          fVar38 = *pfVar3;
          fVar39 = pfVar3[1];
          fVar40 = pfVar3[2];
          fVar41 = pfVar3[3];
          auVar74._0_4_ = fVar22 * fVar38;
          auVar74._4_4_ = fVar23 * fVar39;
          auVar74._8_4_ = fVar24 * fVar40;
          auVar74._12_4_ = fVar25 * fVar41;
          local_1498 = vsubps_avx(auVar74,auVar63);
          auVar75._0_4_ = fVar30 * fVar38;
          auVar75._4_4_ = fVar31 * fVar39;
          auVar75._8_4_ = fVar32 * fVar40;
          auVar75._12_4_ = fVar33 * fVar41;
          auVar118._0_4_ = fVar113 * fVar26;
          auVar118._4_4_ = fVar115 * fVar27;
          auVar118._8_4_ = fVar116 * fVar28;
          auVar118._12_4_ = fVar117 * fVar29;
          auVar91 = vsubps_avx(auVar118,auVar75);
          uVar4 = *(undefined4 *)&(ray->org).field_0;
          auVar119._4_4_ = uVar4;
          auVar119._0_4_ = uVar4;
          auVar119._8_4_ = uVar4;
          auVar119._12_4_ = uVar4;
          local_1468 = vsubps_avx(*(undefined1 (*) [16])(uVar51 + lVar48),auVar119);
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar120._4_4_ = uVar4;
          auVar120._0_4_ = uVar4;
          auVar120._8_4_ = uVar4;
          auVar120._12_4_ = uVar4;
          local_1458 = vsubps_avx(*(undefined1 (*) [16])(uVar51 + 0x10 + lVar48),auVar120);
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar121._4_4_ = uVar4;
          auVar121._0_4_ = uVar4;
          auVar121._8_4_ = uVar4;
          auVar121._12_4_ = uVar4;
          local_1478 = vsubps_avx(*(undefined1 (*) [16])(uVar51 + 0x20 + lVar48),auVar121);
          fVar53 = (ray->dir).field_0.m128[1];
          fVar58 = (ray->dir).field_0.m128[2];
          fVar60 = local_1478._0_4_;
          auVar124._0_4_ = fVar53 * fVar60;
          fVar8 = local_1478._4_4_;
          auVar124._4_4_ = fVar53 * fVar8;
          fVar11 = local_1478._8_4_;
          auVar124._8_4_ = fVar53 * fVar11;
          fVar14 = local_1478._12_4_;
          auVar124._12_4_ = fVar53 * fVar14;
          fVar90 = local_1458._0_4_;
          auVar126._0_4_ = fVar58 * fVar90;
          fVar9 = local_1458._4_4_;
          auVar126._4_4_ = fVar58 * fVar9;
          fVar12 = local_1458._8_4_;
          auVar126._8_4_ = fVar58 * fVar12;
          fVar15 = local_1458._12_4_;
          auVar126._12_4_ = fVar58 * fVar15;
          auVar54 = vsubps_avx(auVar126,auVar124);
          fVar59 = (ray->dir).field_0.m128[0];
          fVar7 = local_1468._0_4_;
          auVar56._0_4_ = fVar58 * fVar7;
          fVar10 = local_1468._4_4_;
          auVar56._4_4_ = fVar58 * fVar10;
          fVar13 = local_1468._8_4_;
          auVar56._8_4_ = fVar58 * fVar13;
          fVar16 = local_1468._12_4_;
          auVar56._12_4_ = fVar58 * fVar16;
          auVar64._0_4_ = fVar59 * fVar60;
          auVar64._4_4_ = fVar59 * fVar8;
          auVar64._8_4_ = fVar59 * fVar11;
          auVar64._12_4_ = fVar59 * fVar14;
          auVar82 = vsubps_avx(auVar64,auVar56);
          auVar65._0_4_ = fVar59 * fVar90;
          auVar65._4_4_ = fVar59 * fVar9;
          auVar65._8_4_ = fVar59 * fVar12;
          auVar65._12_4_ = fVar59 * fVar15;
          auVar76._0_4_ = fVar53 * fVar7;
          auVar76._4_4_ = fVar53 * fVar10;
          auVar76._8_4_ = fVar53 * fVar13;
          auVar76._12_4_ = fVar53 * fVar16;
          auVar83 = vsubps_avx(auVar76,auVar65);
          auVar92 = local_1498;
          auVar77._0_4_ =
               local_1448._0_4_ * fVar59 + fVar53 * local_1498._0_4_ + fVar58 * auVar91._0_4_;
          auVar77._4_4_ =
               local_1448._4_4_ * fVar59 + fVar53 * local_1498._4_4_ + fVar58 * auVar91._4_4_;
          auVar77._8_4_ =
               local_1448._8_4_ * fVar59 + fVar53 * local_1498._8_4_ + fVar58 * auVar91._8_4_;
          auVar77._12_4_ =
               local_1448._12_4_ * fVar59 + fVar53 * local_1498._12_4_ + fVar58 * auVar91._12_4_;
          auVar66._8_8_ = 0x8000000080000000;
          auVar66._0_8_ = 0x8000000080000000;
          auVar86 = vandps_avx(auVar77,auVar66);
          uVar45 = auVar86._0_4_;
          local_1398._0_4_ =
               (float)(uVar45 ^ (uint)(fVar113 * auVar54._0_4_ +
                                      fVar22 * auVar83._0_4_ + fVar30 * auVar82._0_4_));
          uVar109 = auVar86._4_4_;
          local_1398._4_4_ =
               (float)(uVar109 ^
                      (uint)(fVar115 * auVar54._4_4_ +
                            fVar23 * auVar83._4_4_ + fVar31 * auVar82._4_4_));
          uVar110 = auVar86._8_4_;
          local_1398._8_4_ =
               (float)(uVar110 ^
                      (uint)(fVar116 * auVar54._8_4_ +
                            fVar24 * auVar83._8_4_ + fVar32 * auVar82._8_4_));
          uVar111 = auVar86._12_4_;
          local_1398._12_4_ =
               (float)(uVar111 ^
                      (uint)(fVar117 * auVar54._12_4_ +
                            fVar25 * auVar83._12_4_ + fVar33 * auVar82._12_4_));
          local_1388._0_4_ =
               (float)(uVar45 ^ (uint)(fVar38 * auVar54._0_4_ +
                                      fVar34 * auVar83._0_4_ + fVar26 * auVar82._0_4_));
          local_1388._4_4_ =
               (float)(uVar109 ^
                      (uint)(fVar39 * auVar54._4_4_ +
                            fVar35 * auVar83._4_4_ + fVar27 * auVar82._4_4_));
          local_1388._8_4_ =
               (float)(uVar110 ^
                      (uint)(fVar40 * auVar54._8_4_ +
                            fVar36 * auVar83._8_4_ + fVar28 * auVar82._8_4_));
          local_1388._12_4_ =
               (float)(uVar111 ^
                      (uint)(fVar41 * auVar54._12_4_ +
                            fVar37 * auVar83._12_4_ + fVar29 * auVar82._12_4_));
          auVar82 = ZEXT416(0) << 0x20;
          auVar86 = vcmpps_avx(local_1398,auVar82,5);
          auVar54 = vcmpps_avx(local_1388,auVar82,5);
          auVar86 = vandps_avx(auVar86,auVar54);
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          local_1368 = vandps_avx(auVar77,auVar67);
          auVar54 = vcmpps_avx(auVar82,auVar77,4);
          auVar86 = vandps_avx(auVar86,auVar54);
          auVar68._0_4_ = local_1398._0_4_ + local_1388._0_4_;
          auVar68._4_4_ = local_1398._4_4_ + local_1388._4_4_;
          auVar68._8_4_ = local_1398._8_4_ + local_1388._8_4_;
          auVar68._12_4_ = local_1398._12_4_ + local_1388._12_4_;
          auVar54 = vcmpps_avx(auVar68,local_1368,2);
          auVar86 = vandps_avx(auVar86,auVar54);
          auVar54 = local_13a8 & auVar86;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar86 = vandps_avx(auVar86,local_13a8);
            local_1378._0_4_ =
                 (float)(uVar45 ^ (uint)(local_1448._0_4_ * fVar7 +
                                        fVar90 * local_1498._0_4_ + fVar60 * auVar91._0_4_));
            local_1378._4_4_ =
                 (float)(uVar109 ^
                        (uint)(local_1448._4_4_ * fVar10 +
                              fVar9 * local_1498._4_4_ + fVar8 * auVar91._4_4_));
            local_1378._8_4_ =
                 (float)(uVar110 ^
                        (uint)(local_1448._8_4_ * fVar13 +
                              fVar12 * local_1498._8_4_ + fVar11 * auVar91._8_4_));
            local_1378._12_4_ =
                 (float)(uVar111 ^
                        (uint)(local_1448._12_4_ * fVar16 +
                              fVar15 * local_1498._12_4_ + fVar14 * auVar91._12_4_));
            fVar53 = (ray->org).field_0.m128[3];
            fVar58 = local_1368._0_4_;
            auVar69._0_4_ = fVar58 * fVar53;
            fVar59 = local_1368._4_4_;
            auVar69._4_4_ = fVar59 * fVar53;
            fVar60 = local_1368._8_4_;
            auVar69._8_4_ = fVar60 * fVar53;
            fVar90 = local_1368._12_4_;
            auVar69._12_4_ = fVar90 * fVar53;
            auVar54 = vcmpps_avx(auVar69,local_1378,1);
            fVar53 = ray->tfar;
            auVar78._0_4_ = fVar58 * fVar53;
            auVar78._4_4_ = fVar59 * fVar53;
            auVar78._8_4_ = fVar60 * fVar53;
            auVar78._12_4_ = fVar90 * fVar53;
            auVar82 = vcmpps_avx(local_1378,auVar78,2);
            auVar54 = vandps_avx(auVar82,auVar54);
            local_1348 = vandps_avx(auVar54,auVar86);
            uVar45 = vmovmskps_avx(local_1348);
            if (uVar45 != 0) {
              local_1308 = local_1448;
              local_12f8 = local_1498._0_8_;
              uStack_12f0 = local_1498._8_8_;
              local_14b8 = auVar91._0_8_;
              uStack_14b0 = auVar91._8_8_;
              local_12e8 = local_14b8;
              uStack_12e0 = uStack_14b0;
              local_1448._0_8_ = local_1480->scene;
              auVar86 = vrcpps_avx(local_1368);
              fVar53 = auVar86._0_4_;
              auVar70._0_4_ = fVar58 * fVar53;
              fVar58 = auVar86._4_4_;
              auVar70._4_4_ = fVar59 * fVar58;
              fVar59 = auVar86._8_4_;
              auVar70._8_4_ = fVar60 * fVar59;
              fVar60 = auVar86._12_4_;
              auVar70._12_4_ = fVar90 * fVar60;
              auVar79._8_4_ = 0x3f800000;
              auVar79._0_8_ = 0x3f8000003f800000;
              auVar79._12_4_ = 0x3f800000;
              auVar86 = vsubps_avx(auVar79,auVar70);
              fVar53 = fVar53 + fVar53 * auVar86._0_4_;
              fVar58 = fVar58 + fVar58 * auVar86._4_4_;
              fVar59 = fVar59 + fVar59 * auVar86._8_4_;
              fVar60 = fVar60 + fVar60 * auVar86._12_4_;
              local_1318[0] = fVar53 * local_1378._0_4_;
              local_1318[1] = fVar58 * local_1378._4_4_;
              local_1318[2] = fVar59 * local_1378._8_4_;
              local_1318[3] = fVar60 * local_1378._12_4_;
              local_1338._0_4_ = fVar53 * local_1398._0_4_;
              local_1338._4_4_ = fVar58 * local_1398._4_4_;
              local_1338._8_4_ = fVar59 * local_1398._8_4_;
              local_1338._12_4_ = fVar60 * local_1398._12_4_;
              local_1328._0_4_ = fVar53 * local_1388._0_4_;
              local_1328._4_4_ = fVar58 * local_1388._4_4_;
              local_1328._8_4_ = fVar59 * local_1388._8_4_;
              local_1328._12_4_ = fVar60 * local_1388._12_4_;
              uVar44 = (ulong)(uVar45 & 0xff);
              local_1468._0_8_ = lVar48 + uVar51;
              lVar48 = lVar48 + uVar51;
              local_1498 = auVar92;
              do {
                uVar47 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                local_1498._0_8_ = uVar47;
                local_13f0 = *(uint *)(lVar48 + 0x90 + uVar47 * 4);
                local_1430 = *(long *)(*(long *)(local_1448._0_8_ + 0x1e8) + (ulong)local_13f0 * 8);
                if ((*(uint *)(local_1430 + 0x34) & ray->mask) == 0) {
                  uVar44 = uVar44 ^ 1L << (uVar47 & 0x3f);
                }
                else {
                  local_1458._0_8_ = uVar44;
                  if ((local_1480->args->filter == (RTCFilterFunctionN)0x0) &&
                     (*(long *)(local_1430 + 0x48) == 0)) {
LAB_00e75cc9:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_1478._0_8_ = local_1480->args;
                  local_13c8 = local_1480->user;
                  local_1408 = *(undefined4 *)(local_1308 + uVar47 * 4);
                  local_1404 = *(undefined4 *)((long)&local_12f8 + uVar47 * 4);
                  local_1400 = *(undefined4 *)((long)&local_12e8 + uVar47 * 4);
                  local_13fc = *(undefined4 *)(local_1338 + uVar47 * 4);
                  local_13f8 = *(undefined4 *)(local_1328 + uVar47 * 4);
                  local_13f4 = *(undefined4 *)(local_1468._0_8_ + 0xa0 + uVar47 * 4);
                  local_13ec = local_13c8->instID[0];
                  local_13e8 = local_13c8->instPrimID[0];
                  fVar53 = ray->tfar;
                  ray->tfar = local_1318[uVar47];
                  local_149c = -1;
                  local_13d8 = &local_149c;
                  local_13d0 = *(undefined8 *)(local_1430 + 0x18);
                  local_13b8 = &local_1408;
                  local_13b0 = 1;
                  local_13c0 = ray;
                  if ((*(code **)(local_1430 + 0x48) == (code *)0x0) ||
                     ((**(code **)(local_1430 + 0x48))(&local_13d8), *local_13d8 != 0)) {
                    if ((*(code **)(local_1478._0_8_ + 0x10) == (code *)0x0) ||
                       ((((*(byte *)local_1478._0_8_ & 2) == 0 &&
                         ((*(byte *)(local_1430 + 0x3e) & 0x40) == 0)) ||
                        ((**(code **)(local_1478._0_8_ + 0x10))(&local_13d8), *local_13d8 != 0))))
                    goto LAB_00e75cc9;
                  }
                  ray->tfar = fVar53;
                  uVar44 = local_1458._0_8_ ^ 1L << (local_1498._0_8_ & 0x3f);
                }
                lVar48 = local_1468._0_8_;
              } while (uVar44 != 0);
            }
          }
          auVar114 = ZEXT3264(local_1258);
          auVar122 = ZEXT3264(local_1278);
          auVar123 = ZEXT3264(local_1298);
          auVar125 = ZEXT3264(local_12b8);
          auVar127 = ZEXT3264(local_12d8);
        }
        goto LAB_00e7552b;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }